

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O0

int pty_exitcode(Backend *be)

{
  Pty *pty;
  Backend *be_local;
  
  if (((ulong)be[-4].vt & 0x10000000000) == 0) {
    be_local._4_4_ = -1;
  }
  else if ((char)(((byte)*(undefined4 *)&be[-4].interactor & 0x7f) + 1) >> 1 < '\x01') {
    be_local._4_4_ = (int)(*(uint *)&be[-4].interactor & 0xff00) >> 8;
  }
  else {
    be_local._4_4_ = (*(uint *)&be[-4].interactor & 0x7f) + 0x80;
  }
  return be_local._4_4_;
}

Assistant:

static int pty_exitcode(Backend *be)
{
    Pty *pty = container_of(be, Pty, backend);
    if (!pty->finished)
        return -1;                     /* not dead yet */
    else if (WIFSIGNALED(pty->exit_code))
        return 128 + WTERMSIG(pty->exit_code);
    else
        return WEXITSTATUS(pty->exit_code);
}